

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O2

void __thiscall Am_Object_Data::convert_temporary_slot(Am_Object_Data *this,Am_Slot_Key key)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
  uVar1 = (this->data).length;
  pcVar2 = (this->data).data;
  lVar4 = 0;
  do {
    if (uVar1 == (uint)lVar4) {
      convert_temporaries(this,key);
      return;
    }
    lVar3 = *(long *)(pcVar2 + lVar4 * 8);
    if (*(Am_Slot_Key *)(lVar3 + 0x30) == key) {
      if ((*(ushort *)(lVar3 + 0x38) & 2) == 0) {
        return;
      }
      *(ushort *)(lVar3 + 0x38) = *(ushort *)(lVar3 + 0x38) & 0xfcfd | 0x200;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void
Am_Object_Data::convert_temporary_slot(Am_Slot_Key key)
{
  unsigned i;
  Am_Slot_Data **slot_array;
  Am_Slot_Data *slot;

  for (i = data.length, slot_array = (Am_Slot_Data **)data.data; i > 0;
       --i, ++slot_array) {
    slot = *slot_array;
    if (key == slot->key) {
      if (slot->flags & BIT_INHERITS) {
        slot->flags &= ~BIT_INHERITS;
        slot->rule = Am_COPY;
      } else
        return;
    }
  }
  convert_temporaries(key);
}